

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  
  if (-1 < f) {
    iVar1 = Cba_FonRange(p,f);
    iVar2 = Cba_NtkRangeLeft(p,iVar1);
    iVar1 = Cba_NtkRangeRight(p,iVar1);
    iVar2 = iVar2 - iVar1;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    return iVar1 + 1;
  }
  iVar1 = Cba_FonConst(f);
  __nptr = Cba_NtkConst(p,iVar1);
  iVar1 = atoi(__nptr);
  return iVar1;
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }